

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O2

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultCatalog
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *schema)

{
  pointer pCVar1;
  bool bVar2;
  allocator *paVar3;
  char *pcVar4;
  pointer __lhs;
  allocator local_2a;
  allocator local_29;
  
  bVar2 = DefaultSchemaGenerator::IsDefaultSchema(schema);
  if (bVar2) {
    pcVar4 = "system";
    paVar3 = &local_29;
  }
  else {
    pCVar1 = (this->paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (this->paths).
                 super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                 .
                 super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pCVar1; __lhs = __lhs + 1) {
      bVar2 = ::std::operator==(&__lhs->catalog,"temp");
      if ((!bVar2) && (bVar2 = StringUtil::CIEquals(&__lhs->schema,schema), bVar2)) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
        return __return_storage_ptr__;
      }
    }
    pcVar4 = anon_var_dwarf_4b71df5 + 9;
    paVar3 = &local_2a;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar3);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultCatalog(const string &schema) const {
	if (DefaultSchemaGenerator::IsDefaultSchema(schema)) {
		return SYSTEM_CATALOG;
	}
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.schema, schema)) {
			return path.catalog;
		}
	}
	return INVALID_CATALOG;
}